

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::EnforceUniqueDir(cmMakefile *this,string *srcPath,string *binPath)

{
  PolicyStatus PVar1;
  ostream *poVar2;
  PolicyID id;
  bool bVar3;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  string sStack_1b8;
  ostringstream e;
  
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->GlobalGenerator->BinaryDirectories,binPath);
  bVar3 = true;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    PVar1 = cmState::Snapshot::GetPolicy(&this->StateSnapshot,CMP0013);
    bVar3 = true;
    switch(PVar1) {
    case OLD:
      break;
    case WARN:
      cmPolicies::GetPolicyWarning_abi_cxx11_(&sStack_1b8,(cmPolicies *)0xd,id);
      poVar2 = std::operator<<((ostream *)&e,(string *)&sStack_1b8);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,"The binary directory\n");
      poVar2 = std::operator<<(poVar2,"  ");
      poVar2 = std::operator<<(poVar2,(string *)binPath);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,"is already used to build a source directory.  ");
      poVar2 = std::operator<<(poVar2,"This command uses it to build source directory\n");
      poVar2 = std::operator<<(poVar2,"  ");
      poVar2 = std::operator<<(poVar2,(string *)srcPath);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,"which can generate conflicting build files.  ");
      poVar2 = std::operator<<(poVar2,"CMake does not support this use case but it used ");
      poVar2 = std::operator<<(poVar2,"to work accidentally and is being allowed for ");
      std::operator<<(poVar2,"compatibility.");
      std::__cxx11::string::~string((string *)&sStack_1b8);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&sStack_1b8,false);
      std::__cxx11::string::~string((string *)&sStack_1b8);
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&sStack_1b8,(cmPolicies *)0xd,id);
      poVar2 = std::operator<<((ostream *)&e,(string *)&sStack_1b8);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&sStack_1b8);
    case NEW:
      poVar2 = std::operator<<((ostream *)&e,"The binary directory\n");
      poVar2 = std::operator<<(poVar2,"  ");
      poVar2 = std::operator<<(poVar2,(string *)binPath);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,"is already used to build a source directory.  ");
      poVar2 = std::operator<<(poVar2,"It cannot be used to build source directory\n");
      poVar2 = std::operator<<(poVar2,"  ");
      poVar2 = std::operator<<(poVar2,(string *)srcPath);
      poVar2 = std::operator<<(poVar2,"\n");
      std::operator<<(poVar2,"Specify a unique binary directory name.");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&sStack_1b8,false);
      std::__cxx11::string::~string((string *)&sStack_1b8);
    default:
      bVar3 = false;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return bVar3;
}

Assistant:

bool cmMakefile::EnforceUniqueDir(const std::string& srcPath,
                                  const std::string& binPath) const
{
  // Make sure the binary directory is unique.
  cmGlobalGenerator* gg = this->GetGlobalGenerator();
  if(gg->BinaryDirectoryIsNew(binPath))
    {
    return true;
    }
  std::ostringstream e;
  switch (this->GetPolicyStatus(cmPolicies::CMP0013))
    {
    case cmPolicies::WARN:
      // Print the warning.
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0013)
        << "\n"
        << "The binary directory\n"
        << "  " << binPath << "\n"
        << "is already used to build a source directory.  "
        << "This command uses it to build source directory\n"
        << "  " << srcPath << "\n"
        << "which can generate conflicting build files.  "
        << "CMake does not support this use case but it used "
        << "to work accidentally and is being allowed for "
        << "compatibility.";
      this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
    case cmPolicies::OLD:
      // OLD behavior does not warn.
      return true;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0013)
        << "\n";
    case cmPolicies::NEW:
      // NEW behavior prints the error.
      e << "The binary directory\n"
        << "  " << binPath << "\n"
        << "is already used to build a source directory.  "
        << "It cannot be used to build source directory\n"
        << "  " << srcPath << "\n"
        << "Specify a unique binary directory name.";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      break;
    }

  return false;
}